

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O0

int WebPPictureRescale(WebPPicture *picture,int width,int height)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  int in_ESI;
  WebPPicture *in_RDI;
  int iVar3;
  rescaler_t *work;
  int prev_height;
  int prev_width;
  WebPPicture tmp;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint64_t in_stack_fffffffffffffec8;
  undefined1 local_118 [8];
  int local_110;
  int local_10c;
  undefined4 local_ec;
  undefined4 local_e0;
  int local_c8;
  int in_stack_ffffffffffffff3c;
  uint8_t *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  uint8_t *in_stack_ffffffffffffff58;
  WebPEncodingError in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  rescaler_t *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int local_18;
  int local_14;
  WebPPicture *local_10;
  int local_4;
  
  if (in_RDI == (WebPPicture *)0x0) {
    local_4 = 0;
  }
  else {
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar1 = WebPRescalerGetScaledDimensions(in_RDI->width,in_RDI->height,&local_14,&local_18);
    if (iVar1 == 0) {
      local_4 = WebPEncodingSetError(local_10,VP8_ENC_ERROR_BAD_DIMENSION);
    }
    else {
      PictureGrabSpecs((WebPPicture *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (WebPPicture *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))
      ;
      local_110 = local_14;
      local_10c = local_18;
      iVar1 = WebPPictureAlloc((WebPPicture *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (iVar1 == 0) {
        local_4 = WebPEncodingSetError(local_10,in_stack_ffffffffffffff70);
      }
      else {
        if (local_10->use_argb == 0) {
          pvVar2 = WebPSafeMalloc(in_stack_fffffffffffffec8,
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (pvVar2 == (void *)0x0) {
            WebPPictureFree((WebPPicture *)0x15a46a);
            iVar1 = WebPEncodingSetError(local_10,VP8_ENC_ERROR_OUT_OF_MEMORY);
            return iVar1;
          }
          if (local_10->a != (uint8_t *)0x0) {
            WebPInitAlphaProcessing();
            iVar1 = RescalePlane(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
            in_stack_fffffffffffffec0 = local_e0;
            if (iVar1 == 0) {
              iVar1 = WebPEncodingSetError(local_10,VP8_ENC_ERROR_BAD_DIMENSION);
              return iVar1;
            }
          }
          AlphaMultiplyY((WebPPicture *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffebc);
          iVar1 = RescalePlane(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                               in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                               in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                               in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
          if (((iVar1 == 0) ||
              (iVar1 = RescalePlane(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                    in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                    in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                    in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                    in_stack_ffffffffffffff80,in_stack_ffffffffffffff88), iVar1 == 0
              )) || (iVar1 = RescalePlane(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                                          in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff88),
                    iVar1 == 0)) {
            iVar1 = WebPEncodingSetError(local_10,VP8_ENC_ERROR_BAD_DIMENSION);
            return iVar1;
          }
          AlphaMultiplyY((WebPPicture *)CONCAT44(in_stack_fffffffffffffec4,local_ec),
                         in_stack_fffffffffffffebc);
        }
        else {
          pvVar2 = WebPSafeMalloc(in_stack_fffffffffffffec8,
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (pvVar2 == (void *)0x0) {
            WebPPictureFree((WebPPicture *)0x15a6dd);
            iVar1 = WebPEncodingSetError(local_10,VP8_ENC_ERROR_OUT_OF_MEMORY);
            return iVar1;
          }
          WebPInitAlphaProcessing();
          AlphaMultiplyARGB((WebPPicture *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
          iVar3 = local_c8 << 2;
          iVar1 = RescalePlane(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                               in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                               in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                               in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
          if (iVar1 == 0) {
            iVar1 = WebPEncodingSetError(local_10,VP8_ENC_ERROR_BAD_DIMENSION);
            return iVar1;
          }
          AlphaMultiplyARGB((WebPPicture *)CONCAT44(in_stack_fffffffffffffec4,iVar3),
                            in_stack_fffffffffffffebc);
        }
        WebPPictureFree((WebPPicture *)0x15a7ae);
        WebPSafeFree((void *)0x15a7b8);
        memcpy(local_10,local_118,0x100);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int WebPPictureRescale(WebPPicture* picture, int width, int height) {
  WebPPicture tmp;
  int prev_width, prev_height;
  rescaler_t* work;

  if (picture == NULL) return 0;
  prev_width = picture->width;
  prev_height = picture->height;
  if (!WebPRescalerGetScaledDimensions(
          prev_width, prev_height, &width, &height)) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }

  PictureGrabSpecs(picture, &tmp);
  tmp.width = width;
  tmp.height = height;
  if (!WebPPictureAlloc(&tmp)) {
    return WebPEncodingSetError(picture, tmp.error_code);
  }

  if (!picture->use_argb) {
    work = (rescaler_t*)WebPSafeMalloc(2ULL * width, sizeof(*work));
    if (work == NULL) {
      WebPPictureFree(&tmp);
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // If present, we need to rescale alpha first (for AlphaMultiplyY).
    if (picture->a != NULL) {
      WebPInitAlphaProcessing();
      if (!RescalePlane(picture->a, prev_width, prev_height, picture->a_stride,
                        tmp.a, width, height, tmp.a_stride, work, 1)) {
        return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
      }
    }

    // We take transparency into account on the luma plane only. That's not
    // totally exact blending, but still is a good approximation.
    AlphaMultiplyY(picture, 0);
    if (!RescalePlane(picture->y, prev_width, prev_height, picture->y_stride,
                      tmp.y, width, height, tmp.y_stride, work, 1) ||
        !RescalePlane(picture->u, HALVE(prev_width), HALVE(prev_height),
                      picture->uv_stride, tmp.u, HALVE(width), HALVE(height),
                      tmp.uv_stride, work, 1) ||
        !RescalePlane(picture->v, HALVE(prev_width), HALVE(prev_height),
                      picture->uv_stride, tmp.v, HALVE(width), HALVE(height),
                      tmp.uv_stride, work, 1)) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
    }
    AlphaMultiplyY(&tmp, 1);
  } else {
    work = (rescaler_t*)WebPSafeMalloc(2ULL * width * 4, sizeof(*work));
    if (work == NULL) {
      WebPPictureFree(&tmp);
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // In order to correctly interpolate colors, we need to apply the alpha
    // weighting first (black-matting), scale the RGB values, and remove
    // the premultiplication afterward (while preserving the alpha channel).
    WebPInitAlphaProcessing();
    AlphaMultiplyARGB(picture, 0);
    if (!RescalePlane((const uint8_t*)picture->argb, prev_width, prev_height,
                      picture->argb_stride * 4, (uint8_t*)tmp.argb, width,
                      height, tmp.argb_stride * 4, work, 4)) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
    }
    AlphaMultiplyARGB(&tmp, 1);
  }
  WebPPictureFree(picture);
  WebPSafeFree(work);
  *picture = tmp;
  return 1;
}